

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O0

void loader_manager_impl_script_paths_destroy(vector script_paths)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 in_RDI;
  char *path;
  size_t size;
  size_t iterator;
  undefined8 local_10;
  
  uVar1 = vector_size(in_RDI);
  for (local_10 = 0; local_10 < uVar1; local_10 = local_10 + 1) {
    puVar2 = (undefined8 *)vector_at(in_RDI,local_10);
    free((void *)*puVar2);
  }
  vector_destroy(in_RDI);
  return;
}

Assistant:

void loader_manager_impl_script_paths_destroy(vector script_paths)
{
	size_t iterator, size = vector_size(script_paths);

	for (iterator = 0; iterator < size; ++iterator)
	{
		char *path = vector_at_type(script_paths, iterator, char *);

		free(path);
	}

	vector_destroy(script_paths);
}